

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O0

bool __thiscall ExecutorRegVm::AddBreakpoint(ExecutorRegVm *this,uint instruction,bool oneHit)

{
  uint uVar1;
  RegVmCmd *pRVar2;
  RegVmCmd local_2c;
  uint local_24;
  byte local_1d;
  uint pos;
  bool oneHit_local;
  ExecutorRegVm *pEStack_18;
  uint instruction_local;
  ExecutorRegVm *this_local;
  
  local_1d = oneHit;
  pos = instruction;
  pEStack_18 = this;
  uVar1 = FastVector<RegVmCmd,_false,_false>::size(&this->exLinker->exRegVmCode);
  if (instruction < uVar1) {
    local_24 = FastVector<RegVmCmd,_false,_false>::size(&this->breakCode);
    pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[](&this->exLinker->exRegVmCode,pos);
    if (pRVar2->code == '\0') {
      NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"ERROR: cannot set breakpoint on breakpoint")
      ;
      this->execErrorMessage = this->execErrorBuffer;
      this_local._7_1_ = false;
    }
    else {
      if ((local_1d & 1) == 0) {
        pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[](&this->exLinker->exRegVmCode,pos);
        FastVector<RegVmCmd,_false,_false>::push_back(&this->breakCode,pRVar2);
        RegVmCmd::RegVmCmd(&local_2c,rviNop,'\0','\x01','\0',pos + 1);
        FastVector<RegVmCmd,_false,_false>::push_back(&this->breakCode,&local_2c);
        pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[](&this->exLinker->exRegVmCode,pos);
        pRVar2->code = '\0';
        pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[](&this->exLinker->exRegVmCode,pos);
        uVar1 = local_24;
        pRVar2->rB = '\0';
        pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[](&this->exLinker->exRegVmCode,pos);
        pRVar2->argument = uVar1;
      }
      else {
        pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[](&this->exLinker->exRegVmCode,pos);
        FastVector<RegVmCmd,_false,_false>::push_back(&this->breakCode,pRVar2);
        pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[](&this->exLinker->exRegVmCode,pos);
        pRVar2->code = '\0';
        pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[](&this->exLinker->exRegVmCode,pos);
        uVar1 = local_24;
        pRVar2->rB = '\x02';
        pRVar2 = FastVector<RegVmCmd,_false,_false>::operator[](&this->exLinker->exRegVmCode,pos);
        pRVar2->argument = uVar1;
      }
      this_local._7_1_ = true;
    }
  }
  else {
    NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"ERROR: break position out of code range");
    this->execErrorMessage = this->execErrorBuffer;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ExecutorRegVm::AddBreakpoint(unsigned instruction, bool oneHit)
{
	if(instruction >= exLinker->exRegVmCode.size())
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: break position out of code range");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	unsigned pos = breakCode.size();

	if(exLinker->exRegVmCode[instruction].code == rviNop)
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: cannot set breakpoint on breakpoint");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	if(oneHit)
	{
		breakCode.push_back(exLinker->exRegVmCode[instruction]);
		exLinker->exRegVmCode[instruction].code = rviNop;
		exLinker->exRegVmCode[instruction].rB = EXEC_BREAK_ONCE;
		exLinker->exRegVmCode[instruction].argument = pos;
	}
	else
	{
		breakCode.push_back(exLinker->exRegVmCode[instruction]);
		breakCode.push_back(RegVmCmd(rviNop, 0, EXEC_BREAK_RETURN, 0, instruction + 1));

		exLinker->exRegVmCode[instruction].code = rviNop;
		exLinker->exRegVmCode[instruction].rB = EXEC_BREAK_SIGNAL;
		exLinker->exRegVmCode[instruction].argument = pos;
	}
	return true;
}